

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray
          (ServiceDescriptorProto *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  Type *value;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar4;
  int index;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.ServiceDescriptorProto.name");
    target = internal::WireFormatLite::WriteStringToArray(1,(this->name_).ptr_,target);
  }
  iVar2 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar2 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                      (&(this->method_).super_RepeatedPtrFieldBase,index);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::MethodDescriptorProto>
                       (2,value,deterministic,target);
  }
  if ((uVar1 & 2) != 0) {
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::ServiceOptions>
                       (3,this->options_,deterministic,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = ServiceDescriptorProto::unknown_fields(this);
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ServiceDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.ServiceDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  for (unsigned int i = 0, n = this->method_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->method(i), deterministic, target);
  }

  // optional .google.protobuf.ServiceOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->options_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ServiceDescriptorProto)
  return target;
}